

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
argstest::Subparser::Subparser
          (Subparser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args_,ArgumentParser *parser_,Command *command_,HelpParams *helpParams_)

{
  function<bool_(const_argstest::Group_&)> local_70;
  string local_50;
  HelpParams *local_30;
  HelpParams *helpParams__local;
  Command *command__local;
  ArgumentParser *parser__local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args__local;
  Subparser *this_local;
  
  local_30 = helpParams_;
  helpParams__local = (HelpParams *)command_;
  command__local = &parser_->super_Command;
  parser__local = (ArgumentParser *)args_;
  args__local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this;
  std::__cxx11::string::string((string *)&local_50);
  std::function<bool(argstest::Group_const&)>::function<bool(&)(argstest::Group_const&),void>
            ((function<bool(argstest::Group_const&)> *)&local_70,Group::Validators::AllChildGroups);
  Group::Group(&this->super_Group,&local_50,&local_70,None);
  std::function<bool_(const_argstest::Group_&)>::~function(&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_Group).super_Base._vptr_Base = (_func_int **)&PTR__Subparser_00369570;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->args,args_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->kicked);
  this->parser = (ArgumentParser *)command__local;
  this->helpParams = local_30;
  this->command = (Command *)helpParams__local;
  this->isParsed = false;
  return;
}

Assistant:

Subparser(std::vector<std::string> args_, ArgumentParser &parser_, const Command &command_, const HelpParams &helpParams_)
                : Group({}, Validators::AllChildGroups), args(std::move(args_)), parser(&parser_), helpParams(helpParams_), command(command_)
            {
            }